

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  ulong *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  AccelData *pAVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [12];
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [24];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  ulong uVar61;
  undefined4 uVar62;
  Geometry *pGVar63;
  Geometry *pGVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  ulong uVar75;
  ulong *puVar76;
  ulong *puVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar90 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 in_ZMM7 [64];
  uint uVar121;
  uint uVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar127;
  undefined1 auVar164 [32];
  float fVar128;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar150 [16];
  float fVar149;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29e0 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [48];
  undefined1 local_28d0 [16];
  undefined1 local_28c0 [32];
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  undefined1 local_2480 [32];
  undefined1 local_2460 [8];
  float fStack_2458;
  float fStack_2454;
  undefined1 local_2440 [32];
  undefined1 local_2420 [8];
  float fStack_2418;
  float fStack_2414;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [8];
  float fStack_23d8;
  float fStack_23d4;
  undefined1 local_23c0 [32];
  ulong local_23a0 [1134];
  undefined1 auVar115 [64];
  undefined1 auVar114 [64];
  undefined1 auVar144 [64];
  undefined1 auVar148 [64];
  undefined1 auVar169 [64];
  
  auVar29 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
  auVar30 = vpcmpeqd_avx(auVar29,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar97 = vpcmpeqd_avx(auVar29,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar30 = vpackssdw_avx(auVar30,auVar97);
  if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar30 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar30 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar30 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar30 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar30 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar30 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar30 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf]) {
    return;
  }
  auVar97 = vpacksswb_avx(auVar30,auVar30);
  pAVar9 = This->ptr;
  pGVar63 = (Geometry *)
            (ulong)(byte)(SUB161(auVar97 >> 7,0) & 1 | (SUB161(auVar97 >> 0xf,0) & 1) << 1 |
                          (SUB161(auVar97 >> 0x17,0) & 1) << 2 |
                          (SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
                          (SUB161(auVar97 >> 0x27,0) & 1) << 4 |
                          (SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
                          (SUB161(auVar97 >> 0x37,0) & 1) << 6 | SUB161(auVar97 >> 0x3f,0) << 7);
  auVar58 = *(undefined1 (*) [32])ray;
  auVar88 = *(undefined1 (*) [32])ray;
  local_2800 = *(undefined8 *)ray;
  uStack_27f8 = *(undefined8 *)(ray + 8);
  uStack_27f0 = *(undefined8 *)(ray + 0x10);
  uStack_27e8 = *(undefined8 *)(ray + 0x18);
  pRVar1 = ray + 0x20;
  auVar59 = *(undefined1 (*) [32])pRVar1;
  auVar96 = *(undefined1 (*) [32])pRVar1;
  local_2820 = *(undefined8 *)pRVar1;
  uStack_2818 = *(undefined8 *)(ray + 0x28);
  uStack_2810 = *(undefined8 *)(ray + 0x30);
  uStack_2808 = *(undefined8 *)(ray + 0x38);
  auVar164 = *(undefined1 (*) [32])(ray + 0x80);
  auVar79._8_4_ = 0x7fffffff;
  auVar79._0_8_ = 0x7fffffff7fffffff;
  auVar79._12_4_ = 0x7fffffff;
  auVar79._16_4_ = 0x7fffffff;
  auVar79._20_4_ = 0x7fffffff;
  auVar79._24_4_ = 0x7fffffff;
  auVar79._28_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar164,auVar79);
  auVar103._8_4_ = 0x219392ef;
  auVar103._0_8_ = 0x219392ef219392ef;
  auVar103._12_4_ = 0x219392ef;
  auVar103._16_4_ = 0x219392ef;
  auVar103._20_4_ = 0x219392ef;
  auVar103._24_4_ = 0x219392ef;
  auVar103._28_4_ = 0x219392ef;
  auVar81 = vcmpps_avx(auVar81,auVar103,1);
  auVar10 = vblendvps_avx(auVar164,auVar103,auVar81);
  auVar81 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar119 = vandps_avx(auVar81,auVar79);
  auVar119 = vcmpps_avx(auVar119,auVar103,1);
  auVar117 = vblendvps_avx(auVar81,auVar103,auVar119);
  auVar119 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar79 = vandps_avx(auVar119,auVar79);
  auVar79 = vcmpps_avx(auVar79,auVar103,1);
  auVar79 = vblendvps_avx(auVar119,auVar103,auVar79);
  pRVar1 = ray + 0x40;
  auVar60 = *(undefined1 (*) [32])pRVar1;
  auVar103 = *(undefined1 (*) [32])pRVar1;
  local_2840 = *(undefined8 *)pRVar1;
  uStack_2838 = *(undefined8 *)(ray + 0x48);
  uStack_2830 = *(undefined8 *)(ray + 0x50);
  uStack_2828 = *(undefined8 *)(ray + 0x58);
  auVar32 = vrcpps_avx(auVar10);
  local_2860 = auVar32._0_4_;
  fStack_285c = auVar32._4_4_;
  auVar33._4_4_ = auVar10._4_4_ * fStack_285c;
  auVar33._0_4_ = auVar10._0_4_ * local_2860;
  fStack_2858 = auVar32._8_4_;
  auVar33._8_4_ = auVar10._8_4_ * fStack_2858;
  fStack_2854 = auVar32._12_4_;
  auVar33._12_4_ = auVar10._12_4_ * fStack_2854;
  fStack_2850 = auVar32._16_4_;
  auVar33._16_4_ = auVar10._16_4_ * fStack_2850;
  fStack_284c = auVar32._20_4_;
  auVar33._20_4_ = auVar10._20_4_ * fStack_284c;
  fStack_2848 = auVar32._24_4_;
  auVar33._24_4_ = auVar10._24_4_ * fStack_2848;
  auVar33._28_4_ = auVar10._28_4_;
  auVar151._8_4_ = 0x3f800000;
  auVar151._0_8_ = 0x3f8000003f800000;
  auVar151._12_4_ = 0x3f800000;
  auVar151._16_4_ = 0x3f800000;
  auVar151._20_4_ = 0x3f800000;
  auVar151._24_4_ = 0x3f800000;
  auVar151._28_4_ = 0x3f800000;
  auVar33 = vsubps_avx(auVar151,auVar33);
  auVar10 = vrcpps_avx(auVar117);
  local_2860 = local_2860 + local_2860 * auVar33._0_4_;
  fStack_285c = fStack_285c + fStack_285c * auVar33._4_4_;
  fStack_2858 = fStack_2858 + fStack_2858 * auVar33._8_4_;
  fStack_2854 = fStack_2854 + fStack_2854 * auVar33._12_4_;
  fStack_2850 = fStack_2850 + fStack_2850 * auVar33._16_4_;
  fStack_284c = fStack_284c + fStack_284c * auVar33._20_4_;
  fStack_2848 = fStack_2848 + fStack_2848 * auVar33._24_4_;
  fStack_2844 = auVar32._28_4_ + auVar33._28_4_;
  local_2880 = auVar10._0_4_;
  fStack_287c = auVar10._4_4_;
  auVar32._4_4_ = fStack_287c * auVar117._4_4_;
  auVar32._0_4_ = local_2880 * auVar117._0_4_;
  fStack_2878 = auVar10._8_4_;
  auVar32._8_4_ = fStack_2878 * auVar117._8_4_;
  fStack_2874 = auVar10._12_4_;
  auVar32._12_4_ = fStack_2874 * auVar117._12_4_;
  fStack_2870 = auVar10._16_4_;
  auVar32._16_4_ = fStack_2870 * auVar117._16_4_;
  fStack_286c = auVar10._20_4_;
  auVar32._20_4_ = fStack_286c * auVar117._20_4_;
  fStack_2868 = auVar10._24_4_;
  auVar32._24_4_ = fStack_2868 * auVar117._24_4_;
  auVar32._28_4_ = auVar33._28_4_;
  auVar32 = vsubps_avx(auVar151,auVar32);
  auVar117 = vrcpps_avx(auVar79);
  local_2880 = local_2880 + local_2880 * auVar32._0_4_;
  fStack_287c = fStack_287c + fStack_287c * auVar32._4_4_;
  fStack_2878 = fStack_2878 + fStack_2878 * auVar32._8_4_;
  fStack_2874 = fStack_2874 + fStack_2874 * auVar32._12_4_;
  fStack_2870 = fStack_2870 + fStack_2870 * auVar32._16_4_;
  fStack_286c = fStack_286c + fStack_286c * auVar32._20_4_;
  fStack_2868 = fStack_2868 + fStack_2868 * auVar32._24_4_;
  fStack_2864 = auVar10._28_4_ + auVar32._28_4_;
  local_28a0 = auVar117._0_4_;
  fStack_289c = auVar117._4_4_;
  auVar10._4_4_ = auVar79._4_4_ * fStack_289c;
  auVar10._0_4_ = auVar79._0_4_ * local_28a0;
  fStack_2898 = auVar117._8_4_;
  auVar10._8_4_ = auVar79._8_4_ * fStack_2898;
  fStack_2894 = auVar117._12_4_;
  auVar10._12_4_ = auVar79._12_4_ * fStack_2894;
  fStack_2890 = auVar117._16_4_;
  auVar10._16_4_ = auVar79._16_4_ * fStack_2890;
  fStack_288c = auVar117._20_4_;
  auVar10._20_4_ = auVar79._20_4_ * fStack_288c;
  fStack_2888 = auVar117._24_4_;
  auVar10._24_4_ = auVar79._24_4_ * fStack_2888;
  auVar10._28_4_ = auVar79._28_4_;
  auVar79 = vsubps_avx(auVar151,auVar10);
  local_28a0 = auVar79._0_4_ * local_28a0 + local_28a0;
  fStack_289c = auVar79._4_4_ * fStack_289c + fStack_289c;
  fStack_2898 = auVar79._8_4_ * fStack_2898 + fStack_2898;
  fStack_2894 = auVar79._12_4_ * fStack_2894 + fStack_2894;
  fStack_2890 = auVar79._16_4_ * fStack_2890 + fStack_2890;
  fStack_288c = auVar79._20_4_ * fStack_288c + fStack_288c;
  fStack_2888 = auVar79._24_4_ * fStack_2888 + fStack_2888;
  fStack_2884 = auVar79._28_4_ + auVar117._28_4_;
  auVar41 = ZEXT412(0);
  local_27a0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1232(auVar41) << 0x20);
  local_27c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1232(auVar41) << 0x20);
  auVar29 = auVar30 ^ auVar29;
  auVar97 = vpmovsxwd_avx(auVar29);
  auVar29 = vpunpckhwd_avx(auVar29,auVar29);
  local_29e0._16_16_ = auVar29;
  local_29e0._0_16_ = auVar97;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  auVar79 = ZEXT1232(auVar41) << 0x20;
  auVar164 = vcmpps_avx(auVar164,auVar79,1);
  auVar164 = vandps_avx(auVar164,auVar117);
  auVar118._8_4_ = 2;
  auVar118._0_8_ = 0x200000002;
  auVar118._12_4_ = 2;
  auVar118._16_4_ = 2;
  auVar118._20_4_ = 2;
  auVar118._24_4_ = 2;
  auVar118._28_4_ = 2;
  auVar81 = vcmpps_avx(auVar81,auVar79,1);
  auVar81 = vandps_avx(auVar81,auVar118);
  auVar29 = vpmovsxwd_avx(auVar30);
  local_28d0 = vpunpckhwd_avx(auVar30,auVar30);
  auVar81 = vorps_avx(auVar81,auVar164);
  auVar164 = vcmpps_avx(auVar119,auVar79,1);
  auVar119._8_4_ = 4;
  auVar119._0_8_ = 0x400000004;
  auVar119._12_4_ = 4;
  auVar119._16_4_ = 4;
  auVar119._20_4_ = 4;
  auVar119._24_4_ = 4;
  auVar119._28_4_ = 4;
  auVar164 = vandps_avx(auVar119,auVar164);
  local_27e0 = ZEXT1632(auVar29);
  auVar120._16_16_ = local_28d0;
  auVar120._0_16_ = auVar29;
  auVar81 = vorps_avx(auVar81,auVar164);
  auVar164 = vcmpps_avx(auVar79,ZEXT1232(auVar41) << 0x20,0xf);
  local_2900._0_32_ = vblendvps_avx(auVar164,auVar81,auVar120);
LAB_01045af9:
  lVar67 = 0;
  if (pGVar63 != (Geometry *)0x0) {
    for (; ((ulong)pGVar63 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar62 = *(undefined4 *)(local_2900 + lVar67 * 4);
  auVar97._4_4_ = uVar62;
  auVar97._0_4_ = uVar62;
  auVar97._8_4_ = uVar62;
  auVar97._12_4_ = uVar62;
  auVar30 = vpcmpeqd_avx(auVar97,local_2900._0_16_);
  auVar97 = vpcmpeqd_avx(auVar97,local_2900._16_16_);
  auVar30 = vpackssdw_avx(auVar30,auVar97);
  auVar97 = vpmovsxwd_avx(auVar30);
  auVar31 = vpunpckhwd_avx(auVar30,auVar30);
  local_28c0._16_16_ = auVar31;
  local_28c0._0_16_ = auVar97;
  auVar30 = vpacksswb_avx(auVar30,auVar30);
  local_23a0[1] =
       (ulong)(byte)(SUB161(auVar30 >> 7,0) & 1 | (SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar30 >> 0x17,0) & 1) << 2 | (SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar30 >> 0x27,0) & 1) << 4 | (SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar30 >> 0x37,0) & 1) << 6 | SUB161(auVar30 >> 0x3f,0) << 7);
  local_23a0[0] = *(ulong *)&pAVar9[1].bounds.bounds0.lower.field_0;
  auVar110._8_4_ = 0xff800000;
  auVar110._0_8_ = 0xff800000ff800000;
  auVar110._12_4_ = 0xff800000;
  auVar110._16_4_ = 0xff800000;
  auVar110._20_4_ = 0xff800000;
  auVar110._24_4_ = 0xff800000;
  auVar110._28_4_ = 0xff800000;
  local_2920 = vblendvps_avx(auVar110,local_27c0,local_28c0);
  auVar113._8_4_ = 0x7f800000;
  auVar113._0_8_ = 0x7f8000007f800000;
  auVar113._12_4_ = 0x7f800000;
  auVar113._16_4_ = 0x7f800000;
  auVar113._20_4_ = 0x7f800000;
  auVar113._24_4_ = 0x7f800000;
  auVar113._28_4_ = 0x7f800000;
  auVar114 = ZEXT3264(auVar113);
  auVar164 = vblendvps_avx(auVar113,auVar88,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar30 = vminps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar164 = vblendvps_avx(auVar113,auVar96,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar97 = vminps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar97 = vunpcklps_avx(auVar30,auVar97);
  auVar164 = vblendvps_avx(auVar113,auVar103,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar30 = vminps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar164 = vblendvps_avx(auVar110,auVar88,local_28c0);
  auVar31 = vinsertps_avx(auVar97,auVar30,0x28);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar81 = vmaxps_avx(auVar164,auVar81);
  auVar164 = vblendvps_avx(auVar110,auVar96,local_28c0);
  auVar30 = vmaxps_avx(auVar81._0_16_,auVar81._16_16_);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar97 = vmaxps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar97 = vunpcklps_avx(auVar30,auVar97);
  auVar164 = vblendvps_avx(auVar110,auVar103,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar30 = vmaxps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar12 = vinsertps_avx(auVar97,auVar30,0x28);
  auVar56._4_4_ = fStack_285c;
  auVar56._0_4_ = local_2860;
  auVar56._8_4_ = fStack_2858;
  auVar56._12_4_ = fStack_2854;
  auVar56._16_4_ = fStack_2850;
  auVar56._20_4_ = fStack_284c;
  auVar56._24_4_ = fStack_2848;
  auVar56._28_4_ = fStack_2844;
  auVar164 = vblendvps_avx(auVar113,auVar56,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar30 = vminps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar55._4_4_ = fStack_287c;
  auVar55._0_4_ = local_2880;
  auVar55._8_4_ = fStack_2878;
  auVar55._12_4_ = fStack_2874;
  auVar55._16_4_ = fStack_2870;
  auVar55._20_4_ = fStack_286c;
  auVar55._24_4_ = fStack_2868;
  auVar55._28_4_ = fStack_2864;
  auVar164 = vblendvps_avx(auVar113,auVar55,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar97 = vminps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar97 = vunpcklps_avx(auVar30,auVar97);
  auVar54._4_4_ = fStack_289c;
  auVar54._0_4_ = local_28a0;
  auVar54._8_4_ = fStack_2898;
  auVar54._12_4_ = fStack_2894;
  auVar54._16_4_ = fStack_2890;
  auVar54._20_4_ = fStack_288c;
  auVar54._24_4_ = fStack_2888;
  auVar54._28_4_ = fStack_2884;
  auVar164 = vblendvps_avx(auVar113,auVar54,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vminps_avx(auVar164,auVar81);
  auVar30 = vminps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar164 = vblendvps_avx(auVar110,auVar56,local_28c0);
  auVar13 = vinsertps_avx(auVar97,auVar30,0x28);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar81 = vmaxps_avx(auVar164,auVar81);
  auVar164 = vblendvps_avx(auVar110,auVar55,local_28c0);
  auVar30 = vmaxps_avx(auVar81._0_16_,auVar81._16_16_);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar97 = vmaxps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar97 = vunpcklps_avx(auVar30,auVar97);
  auVar164 = vblendvps_avx(auVar110,auVar54,local_28c0);
  auVar81 = vshufps_avx(auVar164,auVar164,0xb1);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar164 = vmaxps_avx(auVar164,auVar81);
  auVar30 = vmaxps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar116 = vinsertps_avx(auVar97,auVar30,0x28);
  local_23c0 = vblendvps_avx(auVar113,local_27a0,local_28c0);
  auVar164 = vshufps_avx(local_23c0,local_23c0,0xb1);
  auVar164 = vminps_avx(local_23c0,auVar164);
  auVar81 = vshufpd_avx(auVar164,auVar164,5);
  auVar81 = vminps_avx(auVar164,auVar81);
  auVar164 = vshufps_avx(local_2920,local_2920,0xb1);
  auVar164 = vmaxps_avx(local_2920,auVar164);
  auVar119 = vshufpd_avx(auVar164,auVar164,5);
  auVar11 = vcmpps_avx(auVar13,_DAT_01f45a50,5);
  auVar30 = vblendvps_avx(auVar116,auVar13,auVar11);
  auVar97 = vblendvps_avx(auVar31,auVar12,auVar11);
  auVar164 = vmaxps_avx(auVar164,auVar119);
  auVar31 = vblendvps_avx(auVar12,auVar31,auVar11);
  auVar168 = ZEXT1664(auVar31);
  auVar12 = vmovshdup_avx(auVar30);
  uVar70 = (ulong)(auVar12._0_4_ < 0.0) << 5 | 0x40;
  auVar12 = vshufpd_avx(auVar30,auVar30,1);
  uVar61 = (ulong)(auVar12._0_4_ < 0.0) << 5 | 0x80;
  pGVar63 = (Geometry *)(~local_23a0[1] & (ulong)pGVar63);
  auVar14 = vminps_avx(auVar81._0_16_,auVar81._16_16_);
  auVar155 = ZEXT1664(auVar14);
  auVar12 = vmaxps_avx(auVar164._0_16_,auVar164._16_16_);
  auVar11 = vblendvps_avx(auVar13,auVar116,auVar11);
  auVar147 = ZEXT1664(auVar11);
  auVar116._0_4_ = auVar30._0_4_ * auVar97._0_4_;
  auVar116._4_4_ = auVar30._4_4_ * auVar97._4_4_;
  auVar116._8_4_ = auVar30._8_4_ * auVar97._8_4_;
  auVar116._12_4_ = auVar30._12_4_ * auVar97._12_4_;
  auVar90._0_4_ = auVar31._0_4_ * auVar11._0_4_;
  auVar90._4_4_ = auVar31._4_4_ * auVar11._4_4_;
  auVar90._8_4_ = auVar31._8_4_ * auVar11._8_4_;
  auVar90._12_4_ = auVar31._12_4_ * auVar11._12_4_;
  auVar133 = ZEXT1664(auVar90);
  uVar71 = (ulong)(auVar30._0_4_ < 0.0) * 0x20;
  auVar97 = vshufps_avx(auVar30,auVar30,0);
  register0x00001210 = auVar97;
  _local_23e0 = auVar97;
  auVar31 = vshufps_avx(auVar116,auVar116,0);
  local_2400._16_16_ = auVar31;
  local_2400._0_16_ = auVar31;
  auVar31 = vshufps_avx(auVar30,auVar30,0x55);
  register0x00001210 = auVar31;
  _local_2420 = auVar31;
  auVar13 = vshufps_avx(auVar116,auVar116,0x55);
  local_2440._16_16_ = auVar13;
  local_2440._0_16_ = auVar13;
  auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
  auVar143 = ZEXT1664(auVar30);
  register0x00001210 = auVar30;
  _local_2460 = auVar30;
  auVar13 = vshufps_avx(auVar116,auVar116,0xaa);
  local_2480._16_16_ = auVar13;
  local_2480._0_16_ = auVar13;
  auVar13 = vshufps_avx(auVar11,auVar11,0);
  register0x00001210 = auVar13;
  _local_24a0 = auVar13;
  auVar116 = vshufps_avx(auVar90,auVar90,0);
  local_24c0._16_16_ = auVar116;
  local_24c0._0_16_ = auVar116;
  auVar116 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001210 = auVar116;
  _local_24e0 = auVar116;
  auVar89 = vshufps_avx(auVar90,auVar90,0x55);
  local_2500._16_16_ = auVar89;
  local_2500._0_16_ = auVar89;
  auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001210 = auVar11;
  _local_2520 = auVar11;
  auVar89 = vshufps_avx(auVar90,auVar90,0xaa);
  local_2540._16_16_ = auVar89;
  local_2540._0_16_ = auVar89;
  auVar14 = vshufps_avx(auVar14,auVar14,0);
  local_2560._16_16_ = auVar14;
  local_2560._0_16_ = auVar14;
  auVar12 = vshufps_avx(auVar12,auVar12,0);
  local_2580._16_16_ = auVar12;
  local_2580._0_16_ = auVar12;
  puVar77 = local_23a0 + 2;
  pGVar64 = pGVar63;
LAB_01045fc4:
  uVar62 = vmovmskps_avx(local_29e0);
  puVar76 = puVar77;
  do {
    if (puVar76 == local_23a0) goto LAB_010467a5;
    puVar77 = puVar76 + -2;
    puVar2 = puVar76 + -1;
    puVar76 = puVar77;
    if ((*puVar2 & ~CONCAT44((int)((ulong)pGVar64 >> 0x20),uVar62)) != 0) {
      uVar66 = 1;
      uVar68 = *puVar77;
      do {
        puVar76 = puVar77;
        if ((uVar68 & 8) != 0) {
          if (uVar66 != 0) {
            local_2940._0_8_ = local_29e0._0_8_ ^ 0xffffffffffffffff;
            local_2940._8_4_ = local_29e0._8_4_ ^ 0xffffffff;
            local_2940._12_4_ = local_29e0._12_4_ ^ 0xffffffff;
            local_2940._16_4_ = local_29e0._16_4_ ^ 0xffffffff;
            local_2940._20_4_ = local_29e0._20_4_ ^ 0xffffffff;
            local_2940._24_4_ = local_29e0._24_4_ ^ 0xffffffff;
            local_2940._28_4_ = local_29e0._28_4_ ^ 0xffffffff;
            local_25a0 = *(undefined8 *)ray;
            uStack_2598 = *(undefined8 *)(ray + 8);
            uStack_2590 = *(undefined8 *)(ray + 0x10);
            uStack_2588 = *(undefined8 *)(ray + 0x18);
            local_25c0 = *(undefined8 *)(ray + 0x20);
            uStack_25b8 = *(undefined8 *)(ray + 0x28);
            uStack_25b0 = *(undefined8 *)(ray + 0x30);
            uStack_25a8 = *(undefined8 *)(ray + 0x38);
            local_2600 = *(undefined8 *)(ray + 0x40);
            uStack_25f8 = *(undefined8 *)(ray + 0x48);
            uStack_25f0 = *(undefined8 *)(ray + 0x50);
            uStack_25e8 = *(undefined8 *)(ray + 0x58);
            uVar42 = *(undefined8 *)(ray + 0x60);
            uVar43 = *(undefined8 *)(ray + 0x68);
            uVar44 = *(undefined8 *)(ray + 0x70);
            local_2760 = uVar42;
            uStack_2758 = uVar43;
            uStack_2750 = uVar44;
            uStack_2748 = *(undefined8 *)(ray + 0x78);
            auVar57 = *(undefined1 (*) [24])(ray + 0xa0);
            local_25e0 = *(undefined8 *)(ray + 0xa0);
            uStack_25d8 = *(undefined8 *)(ray + 0xa8);
            uStack_25d0 = *(undefined8 *)(ray + 0xb0);
            uStack_25c8 = *(undefined8 *)(ray + 0xb8);
            uVar45 = *(undefined8 *)(ray + 0xc0);
            uVar46 = *(undefined8 *)(ray + 200);
            uVar47 = *(undefined8 *)(ray + 0xd0);
            local_2640 = uVar45;
            uStack_2638 = uVar46;
            uStack_2630 = uVar47;
            uStack_2628 = *(undefined8 *)(ray + 0xd8);
            uVar48 = *(undefined8 *)(ray + 0x80);
            uVar49 = *(undefined8 *)(ray + 0x88);
            uVar50 = *(undefined8 *)(ray + 0x90);
            local_2660 = uVar48;
            uStack_2658 = uVar49;
            uStack_2650 = uVar50;
            uStack_2648 = *(undefined8 *)(ray + 0x98);
            uVar51 = *(undefined8 *)(ray + 0x100);
            uVar52 = *(undefined8 *)(ray + 0x108);
            uVar53 = *(undefined8 *)(ray + 0x110);
            local_2780 = uVar51;
            uStack_2778 = uVar52;
            uStack_2770 = uVar53;
            uStack_2768 = *(undefined8 *)(ray + 0x118);
            local_2620 = *(undefined8 *)(ray + 0x120);
            uStack_2618 = *(undefined8 *)(ray + 0x128);
            uStack_2610 = *(undefined8 *)(ray + 0x130);
            uStack_2608 = *(undefined8 *)(ray + 0x138);
            lVar69 = (uVar68 & 0xfffffffffffffff0) + 0x90;
            lVar67 = 0;
            pGVar64 = (Geometry *)ray;
            goto LAB_010463ec;
          }
          break;
        }
        local_23e0._0_4_ = auVar97._0_4_;
        local_23e0._4_4_ = auVar97._4_4_;
        fStack_23d8 = auVar97._8_4_;
        fStack_23d4 = auVar97._12_4_;
        pfVar3 = (float *)(uVar68 + 0x40 + uVar71);
        auVar165._0_4_ = (float)local_23e0._0_4_ * *pfVar3;
        auVar165._4_4_ = (float)local_23e0._4_4_ * pfVar3[1];
        auVar165._8_4_ = fStack_23d8 * pfVar3[2];
        auVar165._12_4_ = fStack_23d4 * pfVar3[3];
        auVar165._16_4_ = (float)local_23e0._0_4_ * pfVar3[4];
        auVar165._20_4_ = (float)local_23e0._4_4_ * pfVar3[5];
        auVar165._28_36_ = auVar133._28_36_;
        auVar165._24_4_ = fStack_23d8 * pfVar3[6];
        auVar164 = vsubps_avx(auVar165._0_32_,local_2400);
        local_2420._0_4_ = auVar31._0_4_;
        local_2420._4_4_ = auVar31._4_4_;
        fStack_2418 = auVar31._8_4_;
        fStack_2414 = auVar31._12_4_;
        pfVar3 = (float *)(uVar68 + 0x40 + uVar70);
        auVar133._0_4_ = (float)local_2420._0_4_ * *pfVar3;
        auVar133._4_4_ = (float)local_2420._4_4_ * pfVar3[1];
        auVar133._8_4_ = fStack_2418 * pfVar3[2];
        auVar133._12_4_ = fStack_2414 * pfVar3[3];
        auVar133._16_4_ = (float)local_2420._0_4_ * pfVar3[4];
        auVar133._20_4_ = (float)local_2420._4_4_ * pfVar3[5];
        auVar133._28_36_ = auVar143._28_36_;
        auVar133._24_4_ = fStack_2418 * pfVar3[6];
        local_2460._0_4_ = auVar30._0_4_;
        local_2460._4_4_ = auVar30._4_4_;
        fStack_2458 = auVar30._8_4_;
        fStack_2454 = auVar30._12_4_;
        pfVar3 = (float *)(uVar68 + 0x40 + uVar61);
        auVar143._0_4_ = (float)local_2460._0_4_ * *pfVar3;
        auVar143._4_4_ = (float)local_2460._4_4_ * pfVar3[1];
        auVar143._8_4_ = fStack_2458 * pfVar3[2];
        auVar143._12_4_ = fStack_2454 * pfVar3[3];
        auVar143._16_4_ = (float)local_2460._0_4_ * pfVar3[4];
        auVar143._20_4_ = (float)local_2460._4_4_ * pfVar3[5];
        auVar143._28_36_ = auVar147._28_36_;
        auVar143._24_4_ = fStack_2458 * pfVar3[6];
        auVar81 = vsubps_avx(auVar133._0_32_,local_2440);
        auVar119 = vsubps_avx(auVar143._0_32_,local_2480);
        local_24a0._0_4_ = auVar13._0_4_;
        local_24a0._4_4_ = auVar13._4_4_;
        fStack_2498 = auVar13._8_4_;
        fStack_2494 = auVar13._12_4_;
        pfVar3 = (float *)(uVar68 + 0x40 + (uVar71 ^ 0x20));
        auVar147._0_4_ = (float)local_24a0._0_4_ * *pfVar3;
        auVar147._4_4_ = (float)local_24a0._4_4_ * pfVar3[1];
        auVar147._8_4_ = fStack_2498 * pfVar3[2];
        auVar147._12_4_ = fStack_2494 * pfVar3[3];
        auVar147._16_4_ = (float)local_24a0._0_4_ * pfVar3[4];
        auVar147._20_4_ = (float)local_24a0._4_4_ * pfVar3[5];
        auVar147._28_36_ = auVar155._28_36_;
        auVar147._24_4_ = fStack_2498 * pfVar3[6];
        auVar79 = vsubps_avx(auVar147._0_32_,local_24c0);
        auVar89 = vpmaxsd_avx(auVar164._0_16_,auVar81._0_16_);
        auVar90 = vpmaxsd_avx(auVar164._16_16_,auVar81._16_16_);
        auVar78 = vpmaxsd_avx(auVar119._0_16_,auVar14);
        auVar89 = vpmaxsd_avx(auVar89,auVar78);
        auVar78 = vpmaxsd_avx(auVar119._16_16_,auVar14);
        local_24e0._0_4_ = auVar116._0_4_;
        local_24e0._4_4_ = auVar116._4_4_;
        fStack_24d8 = auVar116._8_4_;
        fStack_24d4 = auVar116._12_4_;
        pfVar3 = (float *)(uVar68 + 0x40 + (uVar70 ^ 0x20));
        auVar163._0_4_ = (float)local_24e0._0_4_ * *pfVar3;
        auVar163._4_4_ = (float)local_24e0._4_4_ * pfVar3[1];
        auVar163._8_4_ = fStack_24d8 * pfVar3[2];
        auVar163._12_4_ = fStack_24d4 * pfVar3[3];
        auVar163._16_4_ = (float)local_24e0._0_4_ * pfVar3[4];
        auVar163._20_4_ = (float)local_24e0._4_4_ * pfVar3[5];
        auVar163._24_4_ = fStack_24d8 * pfVar3[6];
        auVar163._28_4_ = 0;
        auVar164 = vsubps_avx(auVar163,local_2500);
        auVar90 = vpmaxsd_avx(auVar90,auVar78);
        local_2520._0_4_ = auVar11._0_4_;
        local_2520._4_4_ = auVar11._4_4_;
        fStack_2518 = auVar11._8_4_;
        fStack_2514 = auVar11._12_4_;
        pfVar3 = (float *)(uVar68 + 0x40 + (uVar61 ^ 0x20));
        auVar146._0_4_ = (float)local_2520._0_4_ * *pfVar3;
        auVar146._4_4_ = (float)local_2520._4_4_ * pfVar3[1];
        auVar146._8_4_ = fStack_2518 * pfVar3[2];
        auVar146._12_4_ = fStack_2514 * pfVar3[3];
        auVar146._16_4_ = (float)local_2520._0_4_ * pfVar3[4];
        auVar146._20_4_ = (float)local_2520._4_4_ * pfVar3[5];
        auVar146._24_4_ = fStack_2518 * pfVar3[6];
        auVar146._28_4_ = 0;
        auVar81 = vsubps_avx(auVar146,local_2540);
        auVar129._16_16_ = auVar90;
        auVar129._0_16_ = auVar89;
        auVar89 = vpminsd_avx(auVar79._0_16_,auVar164._0_16_);
        auVar90 = vpminsd_avx(auVar79._16_16_,auVar164._16_16_);
        auVar155 = ZEXT1664(auVar90);
        auVar78 = vpminsd_avx(auVar81._0_16_,auVar12);
        auVar89 = vpminsd_avx(auVar89,auVar78);
        auVar165 = ZEXT1664(auVar12);
        auVar78 = vpminsd_avx(auVar81._16_16_,auVar12);
        auVar90 = vpminsd_avx(auVar90,auVar78);
        auVar147 = ZEXT1664(auVar90);
        auVar141._16_16_ = auVar90;
        auVar141._0_16_ = auVar89;
        auVar143 = ZEXT3264(auVar141);
        auVar164 = vcmpps_avx(auVar129,auVar141,2);
        auVar133 = ZEXT3264(auVar164);
        uVar65 = vmovmskps_avx(auVar164);
        if (uVar65 == 0) break;
        uVar72 = (ulong)(uVar65 & 0xff);
        uVar66 = 0;
        uVar74 = 8;
        do {
          lVar67 = 0;
          if (uVar72 != 0) {
            for (; (uVar72 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
            }
          }
          uVar4 = *(undefined4 *)(uVar68 + 0x40 + lVar67 * 4);
          auVar130._4_4_ = uVar4;
          auVar130._0_4_ = uVar4;
          auVar130._8_4_ = uVar4;
          auVar130._12_4_ = uVar4;
          auVar130._16_4_ = uVar4;
          auVar130._20_4_ = uVar4;
          auVar130._24_4_ = uVar4;
          auVar130._28_4_ = uVar4;
          auVar164 = vsubps_avx(auVar130,auVar58);
          auVar140._0_4_ = auVar164._0_4_ * local_2860;
          auVar140._4_4_ = auVar164._4_4_ * fStack_285c;
          auVar140._8_4_ = auVar164._8_4_ * fStack_2858;
          auVar140._12_4_ = auVar164._12_4_ * fStack_2854;
          auVar144._16_4_ = auVar164._16_4_ * fStack_2850;
          auVar144._0_16_ = auVar140;
          auVar144._20_4_ = auVar164._20_4_ * fStack_284c;
          auVar144._28_36_ = auVar143._28_36_;
          auVar144._24_4_ = auVar164._24_4_ * fStack_2848;
          auVar143 = ZEXT3264(auVar144._0_32_);
          uVar4 = *(undefined4 *)(uVar68 + 0x80 + lVar67 * 4);
          auVar131._4_4_ = uVar4;
          auVar131._0_4_ = uVar4;
          auVar131._8_4_ = uVar4;
          auVar131._12_4_ = uVar4;
          auVar131._16_4_ = uVar4;
          auVar131._20_4_ = uVar4;
          auVar131._24_4_ = uVar4;
          auVar131._28_4_ = uVar4;
          auVar164 = vsubps_avx(auVar131,auVar59);
          auVar145._0_4_ = auVar164._0_4_ * local_2880;
          auVar145._4_4_ = auVar164._4_4_ * fStack_287c;
          auVar145._8_4_ = auVar164._8_4_ * fStack_2878;
          auVar145._12_4_ = auVar164._12_4_ * fStack_2874;
          auVar148._16_4_ = auVar164._16_4_ * fStack_2870;
          auVar148._0_16_ = auVar145;
          auVar148._20_4_ = auVar164._20_4_ * fStack_286c;
          auVar148._28_36_ = auVar147._28_36_;
          auVar148._24_4_ = auVar164._24_4_ * fStack_2868;
          auVar147 = ZEXT3264(auVar148._0_32_);
          uVar4 = *(undefined4 *)(uVar68 + 0xc0 + lVar67 * 4);
          auVar132._4_4_ = uVar4;
          auVar132._0_4_ = uVar4;
          auVar132._8_4_ = uVar4;
          auVar132._12_4_ = uVar4;
          auVar132._16_4_ = uVar4;
          auVar132._20_4_ = uVar4;
          auVar132._24_4_ = uVar4;
          auVar132._28_4_ = uVar4;
          auVar164 = vsubps_avx(auVar132,auVar60);
          auVar112._0_4_ = auVar164._0_4_ * local_28a0;
          auVar112._4_4_ = auVar164._4_4_ * fStack_289c;
          auVar112._8_4_ = auVar164._8_4_ * fStack_2898;
          auVar112._12_4_ = auVar164._12_4_ * fStack_2894;
          auVar115._16_4_ = auVar164._16_4_ * fStack_2890;
          auVar115._0_16_ = auVar112;
          auVar115._20_4_ = auVar164._20_4_ * fStack_288c;
          auVar115._28_36_ = auVar114._28_36_;
          auVar115._24_4_ = auVar164._24_4_ * fStack_2888;
          uVar4 = *(undefined4 *)(uVar68 + 0x60 + lVar67 * 4);
          auVar152._4_4_ = uVar4;
          auVar152._0_4_ = uVar4;
          auVar152._8_4_ = uVar4;
          auVar152._12_4_ = uVar4;
          auVar152._16_4_ = uVar4;
          auVar152._20_4_ = uVar4;
          auVar152._24_4_ = uVar4;
          auVar152._28_4_ = uVar4;
          auVar164 = vsubps_avx(auVar152,auVar58);
          auVar162._0_4_ = auVar164._0_4_ * local_2860;
          auVar162._4_4_ = auVar164._4_4_ * fStack_285c;
          auVar162._8_4_ = auVar164._8_4_ * fStack_2858;
          auVar162._12_4_ = auVar164._12_4_ * fStack_2854;
          auVar114._16_4_ = auVar164._16_4_ * fStack_2850;
          auVar114._0_16_ = auVar162;
          auVar114._20_4_ = auVar164._20_4_ * fStack_284c;
          auVar114._28_36_ = auVar165._28_36_;
          auVar114._24_4_ = auVar164._24_4_ * fStack_2848;
          auVar165 = ZEXT3264(auVar114._0_32_);
          uVar4 = *(undefined4 *)(uVar68 + 0xa0 + lVar67 * 4);
          auVar153._4_4_ = uVar4;
          auVar153._0_4_ = uVar4;
          auVar153._8_4_ = uVar4;
          auVar153._12_4_ = uVar4;
          auVar153._16_4_ = uVar4;
          auVar153._20_4_ = uVar4;
          auVar153._24_4_ = uVar4;
          auVar153._28_4_ = uVar4;
          auVar164 = vsubps_avx(auVar153,auVar59);
          auVar166._0_4_ = auVar164._0_4_ * local_2880;
          auVar166._4_4_ = auVar164._4_4_ * fStack_287c;
          auVar166._8_4_ = auVar164._8_4_ * fStack_2878;
          auVar166._12_4_ = auVar164._12_4_ * fStack_2874;
          auVar169._16_4_ = auVar164._16_4_ * fStack_2870;
          auVar169._0_16_ = auVar166;
          auVar169._20_4_ = auVar164._20_4_ * fStack_286c;
          auVar169._28_36_ = auVar168._28_36_;
          auVar169._24_4_ = auVar164._24_4_ * fStack_2868;
          auVar168 = ZEXT3264(auVar169._0_32_);
          uVar4 = *(undefined4 *)(uVar68 + 0xe0 + lVar67 * 4);
          auVar154._4_4_ = uVar4;
          auVar154._0_4_ = uVar4;
          auVar154._8_4_ = uVar4;
          auVar154._12_4_ = uVar4;
          auVar154._16_4_ = uVar4;
          auVar154._20_4_ = uVar4;
          auVar154._24_4_ = uVar4;
          auVar154._28_4_ = uVar4;
          auVar164 = vsubps_avx(auVar154,auVar60);
          auVar150._0_4_ = auVar164._0_4_ * local_28a0;
          auVar150._4_4_ = auVar164._4_4_ * fStack_289c;
          auVar150._8_4_ = auVar164._8_4_ * fStack_2898;
          auVar150._12_4_ = auVar164._12_4_ * fStack_2894;
          auVar34._16_4_ = auVar164._16_4_ * fStack_2890;
          auVar34._0_16_ = auVar150;
          auVar34._20_4_ = auVar164._20_4_ * fStack_288c;
          auVar34._24_4_ = auVar164._24_4_ * fStack_2888;
          auVar34._28_4_ = auVar164._28_4_;
          auVar155 = ZEXT3264(auVar34);
          auVar89 = vpminsd_avx(auVar140,auVar162);
          auVar90 = vpminsd_avx(auVar144._16_16_,auVar114._16_16_);
          auVar78 = vpminsd_avx(auVar145,auVar166);
          auVar89 = vpmaxsd_avx(auVar89,auVar78);
          auVar78 = vpminsd_avx(auVar148._16_16_,auVar169._16_16_);
          auVar90 = vpmaxsd_avx(auVar90,auVar78);
          auVar78 = vpminsd_avx(auVar115._16_16_,auVar34._16_16_);
          auVar78 = vpmaxsd_avx(auVar78,local_23c0._16_16_);
          auVar90 = vpmaxsd_avx(auVar90,auVar78);
          auVar78 = vpminsd_avx(auVar112,auVar150);
          auVar78 = vpmaxsd_avx(auVar78,local_23c0._0_16_);
          auVar89 = vpmaxsd_avx(auVar78,auVar89);
          auVar91._16_16_ = auVar90;
          auVar91._0_16_ = auVar89;
          auVar89 = vpmaxsd_avx(auVar140,auVar162);
          auVar90 = vpmaxsd_avx(auVar144._16_16_,auVar114._16_16_);
          auVar78 = vpmaxsd_avx(auVar145,auVar166);
          auVar78 = vpminsd_avx(auVar89,auVar78);
          auVar89 = vpmaxsd_avx(auVar148._16_16_,auVar169._16_16_);
          auVar140 = vpminsd_avx(auVar90,auVar89);
          auVar89 = vpmaxsd_avx(auVar115._16_16_,auVar34._16_16_);
          auVar90 = vpmaxsd_avx(auVar112,auVar150);
          auVar114 = ZEXT3264(local_2920);
          auVar89 = vpminsd_avx(auVar89,local_2920._16_16_);
          auVar89 = vpminsd_avx(auVar140,auVar89);
          auVar90 = vpminsd_avx(auVar90,local_2920._0_16_);
          auVar90 = vpminsd_avx(auVar78,auVar90);
          auVar80._16_16_ = auVar89;
          auVar80._0_16_ = auVar90;
          auVar164 = vcmpps_avx(auVar91,auVar80,2);
          auVar133 = ZEXT3264(auVar164);
          uVar75 = uVar74;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            uVar75 = *(ulong *)(uVar68 + lVar67 * 8);
            if (uVar74 != 8) {
              *puVar77 = uVar74;
              puVar77[1] = uVar66;
              puVar77 = puVar77 + 2;
            }
            uVar65 = vmovmskps_avx(auVar164);
            uVar66 = (ulong)uVar65;
          }
          uVar72 = uVar72 & uVar72 - 1;
          uVar74 = uVar75;
        } while (uVar72 != 0);
        uVar68 = uVar75;
        puVar76 = puVar77;
      } while (uVar75 != 8);
    }
  } while( true );
LAB_010463ec:
  do {
    if (lVar67 == (ulong)((uint)uVar68 & 0xf) - 8) break;
    lVar73 = -0x10;
    auVar114 = ZEXT3264(local_2940);
    do {
      if (lVar73 == 0) break;
      uVar66 = (ulong)*(uint *)(lVar69 + 0x10 + lVar73);
      pGVar64 = (Geometry *)0x0;
      if (uVar66 == 0xffffffff) break;
      uVar62 = *(undefined4 *)(lVar69 + -0x80 + lVar73);
      auVar81._4_4_ = uVar62;
      auVar81._0_4_ = uVar62;
      auVar81._8_4_ = uVar62;
      auVar81._12_4_ = uVar62;
      auVar81._16_4_ = uVar62;
      auVar81._20_4_ = uVar62;
      auVar81._24_4_ = uVar62;
      auVar81._28_4_ = uVar62;
      uVar62 = *(undefined4 *)(lVar69 + -0x70 + lVar73);
      auVar92._4_4_ = uVar62;
      auVar92._0_4_ = uVar62;
      auVar92._8_4_ = uVar62;
      auVar92._12_4_ = uVar62;
      auVar92._16_4_ = uVar62;
      auVar92._20_4_ = uVar62;
      auVar92._24_4_ = uVar62;
      auVar92._28_4_ = uVar62;
      local_26c0 = vsubps_avx(auVar81,*(undefined1 (*) [32])ray);
      local_2720 = vsubps_avx(auVar92,*(undefined1 (*) [32])(ray + 0x20));
      uVar62 = *(undefined4 *)(lVar69 + -0x60 + lVar73);
      auVar82._4_4_ = uVar62;
      auVar82._0_4_ = uVar62;
      auVar82._8_4_ = uVar62;
      auVar82._12_4_ = uVar62;
      auVar82._16_4_ = uVar62;
      auVar82._20_4_ = uVar62;
      auVar82._24_4_ = uVar62;
      auVar82._28_4_ = uVar62;
      local_2680 = *(float *)(lVar69 + -0x50 + lVar73);
      local_26a0 = *(float *)(lVar69 + -0x40 + lVar73);
      fVar5 = *(float *)(lVar69 + -0x30 + lVar73);
      auVar143 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,CONCAT412(
                                                  fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))))))));
      fVar6 = *(float *)(lVar69 + -0x20 + lVar73);
      fVar7 = *(float *)(lVar69 + -0x10 + lVar73);
      fVar8 = *(float *)(lVar69 + lVar73);
      local_2740 = vsubps_avx(auVar82,*(undefined1 (*) [32])(ray + 0x40));
      auVar89 = ZEXT416((uint)(fVar8 * local_2680 - fVar5 * fVar6));
      auVar89 = vshufps_avx(auVar89,auVar89,0);
      local_26e0._16_16_ = auVar89;
      local_26e0._0_16_ = auVar89;
      fStack_267c = local_2680;
      fStack_2678 = local_2680;
      fStack_2674 = local_2680;
      fStack_2670 = local_2680;
      fStack_266c = local_2680;
      fStack_2668 = local_2680;
      fStack_2664 = local_2680;
      fStack_269c = local_26a0;
      fStack_2698 = local_26a0;
      fStack_2694 = local_26a0;
      fStack_2690 = local_26a0;
      fStack_268c = local_26a0;
      fStack_2688 = local_26a0;
      fStack_2684 = local_26a0;
      auVar90 = ZEXT416((uint)(local_26a0 * fVar6 - fVar7 * local_2680));
      auVar90 = vshufps_avx(auVar90,auVar90,0);
      local_2700._16_16_ = auVar90;
      local_2700._0_16_ = auVar90;
      fVar15 = auVar57._0_4_;
      fVar128 = local_2740._0_4_;
      auVar93._0_4_ = fVar128 * fVar15;
      fVar18 = auVar57._4_4_;
      fVar134 = local_2740._4_4_;
      auVar93._4_4_ = fVar134 * fVar18;
      fVar21 = auVar57._8_4_;
      fVar135 = local_2740._8_4_;
      auVar93._8_4_ = fVar135 * fVar21;
      fVar24 = auVar57._12_4_;
      fVar136 = local_2740._12_4_;
      auVar93._12_4_ = fVar136 * fVar24;
      fVar26 = auVar57._16_4_;
      fVar137 = local_2740._16_4_;
      auVar93._16_4_ = fVar137 * fVar26;
      fVar27 = auVar57._20_4_;
      fVar138 = local_2740._20_4_;
      auVar93._20_4_ = fVar138 * fVar27;
      fVar28 = (float)*(undefined8 *)(ray + 0xb8);
      fVar139 = local_2740._24_4_;
      auVar93._24_4_ = fVar139 * fVar28;
      auVar93._28_4_ = 0;
      auVar81 = auVar114._0_32_;
      local_2640._0_4_ = (float)uVar45;
      local_2640._4_4_ = (float)((ulong)uVar45 >> 0x20);
      uStack_2638._0_4_ = (float)uVar46;
      uStack_2638._4_4_ = (float)((ulong)uVar46 >> 0x20);
      uStack_2630._0_4_ = (float)uVar47;
      uStack_2630._4_4_ = (float)((ulong)uVar47 >> 0x20);
      uStack_2628._0_4_ = (float)*(undefined8 *)(ray + 0xd8);
      fVar102 = local_2720._0_4_;
      auVar98._0_4_ = fVar102 * (float)local_2640;
      fVar104 = local_2720._4_4_;
      auVar98._4_4_ = fVar104 * local_2640._4_4_;
      fVar105 = local_2720._8_4_;
      auVar98._8_4_ = fVar105 * (float)uStack_2638;
      fVar106 = local_2720._12_4_;
      auVar98._12_4_ = fVar106 * uStack_2638._4_4_;
      fVar107 = local_2720._16_4_;
      auVar98._16_4_ = fVar107 * (float)uStack_2630;
      fVar108 = local_2720._20_4_;
      auVar98._20_4_ = fVar108 * uStack_2630._4_4_;
      fVar109 = local_2720._24_4_;
      auVar98._24_4_ = fVar109 * (float)uStack_2628;
      auVar98._28_4_ = 0;
      auVar79 = vsubps_avx(auVar98,auVar93);
      fVar149 = local_26c0._0_4_;
      fVar156 = local_26c0._4_4_;
      auVar35._4_4_ = fVar156 * local_2640._4_4_;
      auVar35._0_4_ = fVar149 * (float)local_2640;
      fVar157 = local_26c0._8_4_;
      auVar35._8_4_ = fVar157 * (float)uStack_2638;
      fVar158 = local_26c0._12_4_;
      auVar35._12_4_ = fVar158 * uStack_2638._4_4_;
      fVar159 = local_26c0._16_4_;
      auVar35._16_4_ = fVar159 * (float)uStack_2630;
      fVar160 = local_26c0._20_4_;
      auVar35._20_4_ = fVar160 * uStack_2630._4_4_;
      fVar161 = local_26c0._24_4_;
      auVar35._24_4_ = fVar161 * (float)uStack_2628;
      auVar35._28_4_ = 0;
      local_2660._0_4_ = (float)uVar48;
      local_2660._4_4_ = (float)((ulong)uVar48 >> 0x20);
      uStack_2658._0_4_ = (float)uVar49;
      uStack_2658._4_4_ = (float)((ulong)uVar49 >> 0x20);
      uStack_2650._0_4_ = (float)uVar50;
      uStack_2650._4_4_ = (float)((ulong)uVar50 >> 0x20);
      uStack_2648._0_4_ = (float)*(undefined8 *)(ray + 0x98);
      auVar36._4_4_ = fVar134 * local_2660._4_4_;
      auVar36._0_4_ = fVar128 * (float)local_2660;
      auVar36._8_4_ = fVar135 * (float)uStack_2658;
      auVar36._12_4_ = fVar136 * uStack_2658._4_4_;
      auVar36._16_4_ = fVar137 * (float)uStack_2650;
      auVar36._20_4_ = fVar138 * uStack_2650._4_4_;
      auVar36._24_4_ = fVar139 * (float)uStack_2648;
      auVar36._28_4_ = 0;
      auVar10 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = local_2660._4_4_ * fVar104;
      auVar37._0_4_ = (float)local_2660 * fVar102;
      auVar37._8_4_ = (float)uStack_2658 * fVar105;
      auVar37._12_4_ = uStack_2658._4_4_ * fVar106;
      auVar37._16_4_ = (float)uStack_2650 * fVar107;
      auVar37._20_4_ = uStack_2650._4_4_ * fVar108;
      auVar37._24_4_ = (float)uStack_2648 * fVar109;
      auVar37._28_4_ = 0;
      auVar38._4_4_ = fVar156 * fVar18;
      auVar38._0_4_ = fVar149 * fVar15;
      auVar38._8_4_ = fVar157 * fVar21;
      auVar38._12_4_ = fVar158 * fVar24;
      auVar38._16_4_ = fVar159 * fVar26;
      auVar38._20_4_ = fVar160 * fVar27;
      auVar38._24_4_ = fVar161 * fVar28;
      auVar38._28_4_ = 0;
      auVar117 = vsubps_avx(auVar38,auVar37);
      auVar155 = ZEXT3264(auVar117);
      fVar99 = auVar90._0_4_;
      fVar100 = auVar90._4_4_;
      fVar101 = auVar90._8_4_;
      fVar16 = auVar89._0_4_;
      fVar19 = auVar89._4_4_;
      fVar22 = auVar89._8_4_;
      auVar78 = ZEXT416((uint)(fVar5 * fVar7 - local_26a0 * fVar8));
      auVar78 = vshufps_avx(auVar78,auVar78,0);
      fVar17 = auVar78._0_4_;
      fVar20 = auVar78._4_4_;
      fVar23 = auVar78._8_4_;
      fVar25 = auVar78._12_4_;
      auVar111._0_4_ = (float)local_2660 * fVar17 + fVar15 * fVar16 + fVar99 * (float)local_2640;
      auVar111._4_4_ = local_2660._4_4_ * fVar20 + fVar18 * fVar19 + fVar100 * local_2640._4_4_;
      auVar111._8_4_ = (float)uStack_2658 * fVar23 + fVar21 * fVar22 + fVar101 * (float)uStack_2638;
      auVar111._12_4_ =
           uStack_2658._4_4_ * fVar25 + fVar24 * auVar89._12_4_ + auVar90._12_4_ * uStack_2638._4_4_
      ;
      auVar111._16_4_ = (float)uStack_2650 * fVar17 + fVar26 * fVar16 + fVar99 * (float)uStack_2630;
      auVar111._20_4_ = uStack_2650._4_4_ * fVar20 + fVar27 * fVar19 + fVar100 * uStack_2630._4_4_;
      auVar111._24_4_ = (float)uStack_2648 * fVar23 + fVar28 * fVar22 + fVar101 * (float)uStack_2628
      ;
      auVar111._28_4_ = 0;
      auVar94._8_4_ = 0x80000000;
      auVar94._0_8_ = 0x8000000080000000;
      auVar94._12_4_ = 0x80000000;
      auVar94._16_4_ = 0x80000000;
      auVar94._20_4_ = 0x80000000;
      auVar94._24_4_ = 0x80000000;
      auVar94._28_4_ = 0x80000000;
      auVar164 = vandps_avx(auVar111,auVar94);
      uVar65 = auVar164._0_4_;
      auVar167._0_4_ =
           uVar65 ^ (uint)(fVar6 * auVar79._0_4_ + fVar7 * auVar10._0_4_ + fVar8 * auVar117._0_4_);
      uVar121 = auVar164._4_4_;
      auVar167._4_4_ =
           uVar121 ^ (uint)(fVar6 * auVar79._4_4_ + fVar7 * auVar10._4_4_ + fVar8 * auVar117._4_4_);
      uVar122 = auVar164._8_4_;
      auVar167._8_4_ =
           uVar122 ^ (uint)(fVar6 * auVar79._8_4_ + fVar7 * auVar10._8_4_ + fVar8 * auVar117._8_4_);
      uVar123 = auVar164._12_4_;
      auVar167._12_4_ =
           uVar123 ^ (uint)(fVar6 * auVar79._12_4_ +
                           fVar7 * auVar10._12_4_ + fVar8 * auVar117._12_4_);
      uVar124 = auVar164._16_4_;
      auVar167._16_4_ =
           uVar124 ^ (uint)(fVar6 * auVar79._16_4_ +
                           fVar7 * auVar10._16_4_ + fVar8 * auVar117._16_4_);
      uVar125 = auVar164._20_4_;
      auVar167._20_4_ =
           uVar125 ^ (uint)(fVar6 * auVar79._20_4_ +
                           fVar7 * auVar10._20_4_ + fVar8 * auVar117._20_4_);
      uVar126 = auVar164._24_4_;
      auVar167._24_4_ =
           uVar126 ^ (uint)(fVar6 * auVar79._24_4_ +
                           fVar7 * auVar10._24_4_ + fVar8 * auVar117._24_4_);
      uVar127 = auVar164._28_4_;
      auVar167._28_4_ = uVar127;
      auVar168 = ZEXT3264(auVar167);
      auVar119 = vcmpps_avx(auVar167,_DAT_01f7b000,5);
      auVar147 = ZEXT3264(auVar119);
      auVar32 = auVar81 & auVar119;
      auVar164._8_8_ = mm_lookupmask_ps._24_8_;
      auVar164._0_8_ = mm_lookupmask_ps._16_8_;
      auVar164._16_8_ = mm_lookupmask_ps._16_8_;
      auVar164._24_8_ = mm_lookupmask_ps._24_8_;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0x7f,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar32 >> 0xbf,0) != '\0') ||
          (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar32[0x1f] < '\0') {
        auVar119 = vandps_avx(auVar119,auVar81);
        auVar142._0_4_ =
             uVar65 ^ (uint)(auVar79._0_4_ * local_2680 +
                            auVar10._0_4_ * local_26a0 + fVar5 * auVar117._0_4_);
        auVar142._4_4_ =
             uVar121 ^ (uint)(auVar79._4_4_ * local_2680 +
                             auVar10._4_4_ * local_26a0 + fVar5 * auVar117._4_4_);
        auVar142._8_4_ =
             uVar122 ^ (uint)(auVar79._8_4_ * local_2680 +
                             auVar10._8_4_ * local_26a0 + fVar5 * auVar117._8_4_);
        auVar142._12_4_ =
             uVar123 ^ (uint)(auVar79._12_4_ * local_2680 +
                             auVar10._12_4_ * local_26a0 + fVar5 * auVar117._12_4_);
        auVar142._16_4_ =
             uVar124 ^ (uint)(auVar79._16_4_ * local_2680 +
                             auVar10._16_4_ * local_26a0 + fVar5 * auVar117._16_4_);
        auVar142._20_4_ =
             uVar125 ^ (uint)(auVar79._20_4_ * local_2680 +
                             auVar10._20_4_ * local_26a0 + fVar5 * auVar117._20_4_);
        auVar142._24_4_ =
             uVar126 ^ (uint)(auVar79._24_4_ * local_2680 +
                             auVar10._24_4_ * local_26a0 + fVar5 * auVar117._24_4_);
        auVar142._28_4_ = uVar127;
        auVar143 = ZEXT3264(auVar142);
        auVar79 = vcmpps_avx(auVar142,_DAT_01f7b000,5);
        auVar155 = ZEXT3264(auVar79);
        auVar10 = auVar119 & auVar79;
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0x7f,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0xbf,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          auVar84._8_4_ = 0x7fffffff;
          auVar84._0_8_ = 0x7fffffff7fffffff;
          auVar84._12_4_ = 0x7fffffff;
          auVar84._16_4_ = 0x7fffffff;
          auVar84._20_4_ = 0x7fffffff;
          auVar84._24_4_ = 0x7fffffff;
          auVar84._28_4_ = 0x7fffffff;
          auVar10 = vandps_avx(auVar111,auVar84);
          auVar119 = vandps_avx(auVar79,auVar119);
          auVar155 = ZEXT3264(auVar119);
          auVar164 = vsubps_avx(auVar10,auVar167);
          auVar79 = vcmpps_avx(auVar164,auVar142,5);
          auVar143 = ZEXT3264(auVar79);
          auVar117 = auVar119 & auVar79;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar119 = vandps_avx(auVar79,auVar119);
            auVar143 = ZEXT3264(auVar119);
            auVar85._0_4_ = uVar65 ^ (uint)(fVar17 * fVar149 + fVar102 * fVar16 + fVar128 * fVar99);
            auVar85._4_4_ =
                 uVar121 ^ (uint)(fVar20 * fVar156 + fVar104 * fVar19 + fVar134 * fVar100);
            auVar85._8_4_ =
                 uVar122 ^ (uint)(fVar23 * fVar157 + fVar105 * fVar22 + fVar135 * fVar101);
            auVar85._12_4_ =
                 uVar123 ^ (uint)(fVar25 * fVar158 +
                                 fVar106 * auVar89._12_4_ + fVar136 * auVar90._12_4_);
            auVar85._16_4_ =
                 uVar124 ^ (uint)(fVar17 * fVar159 + fVar107 * fVar16 + fVar137 * fVar99);
            auVar85._20_4_ =
                 uVar125 ^ (uint)(fVar20 * fVar160 + fVar108 * fVar19 + fVar138 * fVar100);
            auVar85._24_4_ =
                 uVar126 ^ (uint)(fVar23 * fVar161 + fVar109 * fVar22 + fVar139 * fVar101);
            auVar85._28_4_ =
                 uVar127 ^ (uint)((float)local_2720._28_4_ +
                                 (float)local_2720._28_4_ + (float)local_2740._28_4_);
            local_2760._0_4_ = (float)uVar42;
            local_2760._4_4_ = (float)((ulong)uVar42 >> 0x20);
            uStack_2758._0_4_ = (float)uVar43;
            uStack_2758._4_4_ = (float)((ulong)uVar43 >> 0x20);
            uStack_2750._0_4_ = (float)uVar44;
            uStack_2750._4_4_ = (float)((ulong)uVar44 >> 0x20);
            uStack_2748._0_4_ = (float)*(undefined8 *)(ray + 0x78);
            auVar39._4_4_ = auVar10._4_4_ * local_2760._4_4_;
            auVar39._0_4_ = auVar10._0_4_ * (float)local_2760;
            auVar39._8_4_ = auVar10._8_4_ * (float)uStack_2758;
            auVar39._12_4_ = auVar10._12_4_ * uStack_2758._4_4_;
            auVar39._16_4_ = auVar10._16_4_ * (float)uStack_2750;
            auVar39._20_4_ = auVar10._20_4_ * uStack_2750._4_4_;
            auVar39._24_4_ = auVar10._24_4_ * (float)uStack_2748;
            auVar39._28_4_ = local_2720._28_4_;
            auVar164 = vcmpps_avx(auVar39,auVar85,1);
            local_2780._0_4_ = (float)uVar51;
            local_2780._4_4_ = (float)((ulong)uVar51 >> 0x20);
            uStack_2778._0_4_ = (float)uVar52;
            uStack_2778._4_4_ = (float)((ulong)uVar52 >> 0x20);
            uStack_2770._0_4_ = (float)uVar53;
            uStack_2770._4_4_ = (float)((ulong)uVar53 >> 0x20);
            uStack_2768._0_4_ = (float)*(undefined8 *)(ray + 0x118);
            auVar40._4_4_ = auVar10._4_4_ * local_2780._4_4_;
            auVar40._0_4_ = auVar10._0_4_ * (float)local_2780;
            auVar40._8_4_ = auVar10._8_4_ * (float)uStack_2778;
            auVar40._12_4_ = auVar10._12_4_ * uStack_2778._4_4_;
            auVar40._16_4_ = auVar10._16_4_ * (float)uStack_2770;
            auVar40._20_4_ = auVar10._20_4_ * uStack_2770._4_4_;
            auVar40._24_4_ = auVar10._24_4_ * (float)uStack_2768;
            auVar40._28_4_ = fVar25;
            auVar79 = vcmpps_avx(auVar85,auVar40,2);
            auVar79 = vandps_avx(auVar79,auVar164);
            auVar10 = auVar119 & auVar79;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar164 = vandps_avx(auVar79,auVar119);
              auVar119 = vcmpps_avx(auVar111,_DAT_01f7b000,4);
              auVar143 = ZEXT3264(auVar119);
              auVar79 = auVar164 & auVar119;
              if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar79 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar79 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar79 >> 0x7f,0) == '\0') &&
                    (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar79 >> 0xbf,0) == '\0') &&
                  (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar79[0x1f]) {
              }
              else {
                auVar164 = vandps_avx(auVar119,auVar164);
              }
            }
          }
        }
      }
      pGVar64 = (context->scene->geometries).items[uVar66].ptr;
      uVar65 = pGVar64->mask;
      auVar83._4_4_ = uVar65;
      auVar83._0_4_ = uVar65;
      auVar83._8_4_ = uVar65;
      auVar83._12_4_ = uVar65;
      auVar83._16_4_ = uVar65;
      auVar83._20_4_ = uVar65;
      auVar83._24_4_ = uVar65;
      auVar83._28_4_ = uVar65;
      auVar119 = vandps_avx(auVar83,*(undefined1 (*) [32])(ray + 0x120));
      auVar89 = vpcmpeqd_avx(auVar119._16_16_,ZEXT816(0) << 0x40);
      auVar90 = vpcmpeqd_avx(auVar119._0_16_,ZEXT816(0) << 0x40);
      auVar95._16_16_ = auVar89;
      auVar95._0_16_ = auVar90;
      auVar119 = vblendps_avx(ZEXT1632(auVar90),auVar95,0xf0);
      auVar79 = auVar164 & ~auVar119;
      if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar79 >> 0x7f,0) != '\0') ||
            (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar79 >> 0xbf,0) != '\0') ||
          (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar79[0x1f] < '\0') {
        auVar164 = vandnps_avx(auVar119,auVar164);
        auVar81 = vandnps_avx(auVar164,auVar81);
      }
      auVar114 = ZEXT3264(auVar81);
      lVar73 = lVar73 + 4;
    } while ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar81 >> 0x7f,0) != '\0') ||
               (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar81 >> 0xbf,0) != '\0') ||
             (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar81[0x1f] < '\0');
    auVar164 = vandps_avx(auVar114._0_32_,local_2940);
    lVar67 = lVar67 + 1;
    lVar69 = lVar69 + 0xb0;
    auVar81 = local_2940 & auVar114._0_32_;
    local_2940 = auVar164;
  } while ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar81 >> 0x7f,0) != '\0') ||
             (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar81 >> 0xbf,0) != '\0') ||
           (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar81[0x1f] < '\0');
  auVar133 = ZEXT3264(local_2940);
  auVar86._0_8_ = local_2940._0_8_ ^ 0xffffffffffffffff;
  auVar86._8_4_ = local_2940._8_4_ ^ 0xffffffff;
  auVar86._12_4_ = local_2940._12_4_ ^ 0xffffffff;
  auVar86._16_4_ = local_2940._16_4_ ^ 0xffffffff;
  auVar86._20_4_ = local_2940._20_4_ ^ 0xffffffff;
  auVar86._24_4_ = local_2940._24_4_ ^ 0xffffffff;
  auVar86._28_4_ = local_2940._28_4_ ^ 0xffffffff;
  local_29e0 = vorps_avx(local_29e0,auVar86);
  auVar164 = local_28c0 & ~local_29e0;
  if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar164 >> 0x7f,0) == '\0') &&
        (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar164 >> 0xbf,0) == '\0') &&
      (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar164[0x1f])
  goto LAB_010467a5;
  local_28c0 = vandnps_avx(local_29e0,local_28c0);
  auVar87._8_4_ = 0xff800000;
  auVar87._0_8_ = 0xff800000ff800000;
  auVar87._12_4_ = 0xff800000;
  auVar87._16_4_ = 0xff800000;
  auVar87._20_4_ = 0xff800000;
  auVar87._24_4_ = 0xff800000;
  auVar87._28_4_ = 0xff800000;
  local_2920 = vblendvps_avx(local_2920,auVar87,local_29e0);
  goto LAB_01045fc4;
LAB_010467a5:
  if (pGVar63 == (Geometry *)0x0) {
    auVar88._16_16_ = local_28d0;
    auVar88._0_16_ = auVar29;
    auVar164 = vandps_avx(auVar88,local_29e0);
    auVar96._8_4_ = 0xff800000;
    auVar96._0_8_ = 0xff800000ff800000;
    auVar96._12_4_ = 0xff800000;
    auVar96._16_4_ = 0xff800000;
    auVar96._20_4_ = 0xff800000;
    auVar96._24_4_ = 0xff800000;
    auVar96._28_4_ = 0xff800000;
    auVar164 = vmaskmovps_avx(auVar164,auVar96);
    *(undefined1 (*) [32])(ray + 0x100) = auVar164;
    return;
  }
  goto LAB_01045af9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }